

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O3

void __thiscall
cmExtraEclipseCDT4Generator::CreateLinksForTargets
          (cmExtraEclipseCDT4Generator *this,cmXMLWriter *xml)

{
  cmGlobalGenerator *pcVar1;
  cmLocalGenerator *pcVar2;
  cmMakefile *this_00;
  __uniq_ptr_data<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>,_true,_true> this_01;
  cmSourceFile *this_02;
  pointer ppcVar3;
  TargetType TVar4;
  string *psVar5;
  cmSourceGroup *this_03;
  pointer puVar6;
  pointer puVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  pointer ppcVar9;
  pointer puVar10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> files;
  string linkName2;
  string linkName;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> sourceGroups;
  string local_108;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_d8;
  cmXMLWriter *local_b8;
  string local_b0;
  string local_90;
  pointer local_70;
  pointer local_68;
  pointer local_60;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *local_58;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined8 local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"[Targets]","");
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"virtual:/virtual","");
  AppendLinkedResource(xml,&local_90,&local_108,VirtualFolder);
  local_b8 = xml;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) + 1);
  }
  pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  puVar6 = (pcVar1->LocalGenerators).
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_70 = (pcVar1->LocalGenerators).
             super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar6 != local_70) {
    do {
      pcVar2 = (puVar6->_M_t).
               super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
               super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
               super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
      puVar7 = *(pointer *)
                &(pcVar2->GeneratorTargets).
                 super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                 ._M_impl;
      puVar10 = *(pointer *)
                 ((long)&(pcVar2->GeneratorTargets).
                         super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                 + 8);
      local_68 = puVar6;
      if (puVar7 != puVar10) {
        this_00 = pcVar2->Makefile;
        local_58 = &this_00->SourceGroups;
        local_60 = puVar10;
        do {
          paVar8 = &local_108.field_2;
          local_108._M_dataplus._M_p = (pointer)0x1;
          local_108.field_2._M_local_buf[0] = '/';
          local_50._M_len = local_90._M_string_length;
          local_50._M_str = local_90._M_dataplus._M_p;
          local_40 = 1;
          views._M_len = 2;
          views._M_array = &local_50;
          local_108._M_string_length = (size_type)paVar8;
          local_38 = paVar8;
          cmCatViews_abi_cxx11_(&local_b0,views);
          TVar4 = cmGeneratorTarget::GetType
                            ((cmGeneratorTarget *)
                             (puVar7->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                            );
          if (TVar4 < UTILITY) {
            cmGeneratorTarget::GetType
                      ((cmGeneratorTarget *)
                       (puVar7->_M_t).
                       super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                      );
            std::__cxx11::string::append((char *)&local_b0);
            psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                               ((cmGeneratorTarget *)
                                (puVar7->_M_t).
                                super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               );
            std::__cxx11::string::_M_append((char *)&local_b0,(ulong)(psVar5->_M_dataplus)._M_p);
            local_108._M_dataplus._M_p = (pointer)paVar8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_108,"virtual:/virtual","");
            AppendLinkedResource(local_b8,&local_b0,&local_108,VirtualFolder);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != paVar8) {
              operator_delete(local_108._M_dataplus._M_p,
                              CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                       local_108.field_2._M_local_buf[0]) + 1);
            }
            if (this->GenerateLinkedResources != false) {
              std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
                        ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)&local_50,local_58
                        );
              local_d8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_d8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_d8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              this_01.
              super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>._M_t
              .super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
              super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
                   (puVar7->_M_t).
                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
              ;
              local_108._M_dataplus._M_p = (pointer)paVar8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_108,"CMAKE_BUILD_TYPE","");
              psVar5 = cmMakefile::GetSafeDefinition(this_00,&local_108);
              cmGeneratorTarget::GetSourceFiles
                        ((cmGeneratorTarget *)
                         this_01.
                         super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                         .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,&local_d8,
                         psVar5);
              ppcVar9 = local_d8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppcVar3 = local_d8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p != paVar8) {
                operator_delete(local_108._M_dataplus._M_p,
                                CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                         local_108.field_2._M_local_buf[0]) + 1);
                ppcVar9 = local_d8.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                ppcVar3 = local_d8.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              }
              for (; ppcVar9 != ppcVar3; ppcVar9 = ppcVar9 + 1) {
                this_02 = *ppcVar9;
                psVar5 = cmSourceFile::ResolveFullPath(this_02,(string *)0x0,(string *)0x0);
                this_03 = cmMakefile::FindSourceGroup
                                    (this_00,psVar5,
                                     (vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)
                                     &local_50);
                cmSourceGroup::AssignSource(this_03,this_02);
              }
              WriteGroups(this,(vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)&local_50,
                          &local_b0,local_b8);
              puVar10 = local_60;
              if (local_d8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_d8.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_d8.
                                      super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_d8.
                                      super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector
                        ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)&local_50);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          puVar7 = puVar7 + 1;
        } while (puVar7 != puVar10);
      }
      puVar6 = local_68 + 1;
    } while (puVar6 != local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateLinksForTargets(cmXMLWriter& xml)
{
  std::string linkName = "[Targets]";
  cmExtraEclipseCDT4Generator::AppendLinkedResource(
    xml, linkName, "virtual:/virtual", VirtualFolder);

  for (const auto& lg : this->GlobalGenerator->GetLocalGenerators()) {
    cmMakefile* makefile = lg->GetMakefile();
    const auto& targets = lg->GetGeneratorTargets();

    for (const auto& target : targets) {
      std::string linkName2 = cmStrCat(linkName, '/');
      switch (target->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          const char* prefix =
            (target->GetType() == cmStateEnums::EXECUTABLE ? "[exe] "
                                                           : "[lib] ");
          linkName2 += prefix;
          linkName2 += target->GetName();
          cmExtraEclipseCDT4Generator::AppendLinkedResource(
            xml, linkName2, "virtual:/virtual", VirtualFolder);
          if (!this->GenerateLinkedResources) {
            break; // skip generating the linked resources to the source files
          }
          std::vector<cmSourceGroup> sourceGroups =
            makefile->GetSourceGroups();
          // get the files from the source lists then add them to the groups
          std::vector<cmSourceFile*> files;
          target->GetSourceFiles(
            files, makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for (cmSourceFile* sf : files) {
            // Add the file to the list of sources.
            std::string const& source = sf->ResolveFullPath();
            cmSourceGroup* sourceGroup =
              makefile->FindSourceGroup(source, sourceGroups);
            sourceGroup->AssignSource(sf);
          }

          this->WriteGroups(sourceGroups, linkName2, xml);
        } break;
        // ignore all others:
        default:
          break;
      }
    }
  }
}